

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::Verify(ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  reference __args;
  UtxoData *in_RSI;
  long *in_RDI;
  value_type *txin;
  UtxoData utxo;
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *in_stack_00000660;
  AbstractTxIn *in_stack_00000668;
  UtxoData *in_stack_00000670;
  OutPoint *in_stack_00000678;
  ConfidentialTransactionContext *in_stack_00000680;
  string *in_stack_fffffffffffffa60;
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *this_00;
  undefined8 in_stack_fffffffffffffa68;
  CfdError error_code;
  OutPoint *outpoint_00;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  ConfidentialTransactionContext *in_stack_fffffffffffffa78;
  UtxoData *in_stack_fffffffffffffab0;
  UtxoData *in_stack_fffffffffffffab8;
  OutPoint *in_stack_fffffffffffffac0;
  undefined6 in_stack_fffffffffffffac8;
  undefined1 in_stack_ffffffffffffface;
  allocator in_stack_fffffffffffffacf;
  string local_530 [1312];
  UtxoData *local_10;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  local_10 = in_RSI;
  UtxoData::UtxoData(in_stack_fffffffffffffab0);
  bVar1 = IsFindUtxoMap((ConfidentialTransactionContext *)
                        CONCAT17(in_stack_fffffffffffffacf,
                                 CONCAT16(in_stack_ffffffffffffface,in_stack_fffffffffffffac8)),
                        in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_530,"Utxo is not found. verify fail.",(allocator *)&stack0xfffffffffffffacf);
    core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
               error_code,in_stack_fffffffffffffa60);
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  outpoint_00 = (OutPoint *)(in_RDI + 2);
  uVar2 = (**(code **)(*in_RDI + 0x78))(in_RDI,local_10);
  __args = std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
           operator[]((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                       *)outpoint_00,(ulong)uVar2);
  this_00 = (function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
             *)&stack0xfffffffffffffaa0;
  std::
  function<cfd::core::ByteData256(cfd::ConfidentialTransactionContext_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*)>
  ::
  function<cfd::core::ByteData256(&)(cfd::ConfidentialTransactionContext_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*),void>
            (this_00,(_func_ByteData256_ConfidentialTransactionContext_ptr_OutPoint_ptr_UtxoData_ptr_SigHashType_ptr_Pubkey_ptr_Script_ptr_WitnessVersion_ByteData_ptr_TaprootScriptTree_ptr
                      *)__args);
  TransactionContextUtil::Verify<cfd::ConfidentialTransactionContext>
            (in_stack_00000680,in_stack_00000678,in_stack_00000670,in_stack_00000668,
             in_stack_00000660);
  std::
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  ::~function((function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *)0x5558d4);
  bVar1 = IsFindOutPoint(in_stack_fffffffffffffa78,
                         (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                         CONCAT44(uVar2,in_stack_fffffffffffffa70),outpoint_00);
  if (!bVar1) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>
              ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)this_00,
               (OutPoint *)__args);
  }
  UtxoData::~UtxoData(local_10);
  return;
}

Assistant:

void ConfidentialTransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  TransactionContextUtil::Verify<ConfidentialTransactionContext>(
      this, outpoint, utxo, &txin, CreateConfidentialTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}